

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[13]>
* __thiscall
Catch::ExprLhs<std::__cxx11::string_const&>::operator==
          (BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[13]>
           *__return_storage_ptr__,ExprLhs<std::__cxx11::string_const&> *this,char (*rhs) [13])

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  bool comparisonResult;
  StringRef local_30;
  char (*local_20) [13];
  char (*rhs_local) [13];
  ExprLhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_local;
  
  local_20 = rhs;
  rhs_local = (char (*) [13])this;
  this_local = (ExprLhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)__return_storage_ptr__;
  comparisonResult =
       compareEqual<std::__cxx11::string,char[13]>
                 (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this,rhs);
  lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[13]>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }